

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O3

void ga_add_patch_(void *alpha,Integer *g_a,Integer *ailo,Integer *aihi,Integer *ajlo,Integer *ajhi,
                  void *beta,Integer *g_b,Integer *bilo,Integer *bihi,Integer *bjlo,Integer *bjhi,
                  Integer *g_c,Integer *cilo,Integer *cihi,Integer *cjlo,Integer *cjhi)

{
  Integer local_98;
  Integer local_90;
  Integer clo [2];
  Integer bhi [2];
  Integer blo [2];
  Integer ahi [2];
  Integer alo [2];
  
  alo[0] = *ailo;
  ahi[0] = *aihi;
  alo[1] = *ajlo;
  ahi[1] = *ajhi;
  blo[0] = *bilo;
  bhi[0] = *bihi;
  blo[1] = *bjlo;
  bhi[1] = *bjhi;
  clo[0] = *cilo;
  local_98 = *cihi;
  clo[1] = *cjlo;
  local_90 = *cjhi;
  pnga_add_patch(alpha,*g_a,alo,ahi,beta,*g_b,blo,bhi,*g_c,clo,&local_98);
  return;
}

Assistant:

void FATR ga_add_patch_(void *alpha, Integer *g_a, Integer *ailo, Integer *aihi, Integer *ajlo, Integer *ajhi, void *beta, Integer *g_b, Integer *bilo, Integer *bihi, Integer *bjlo, Integer *bjhi, Integer *g_c, Integer *cilo, Integer *cihi, Integer *cjlo, Integer *cjhi)
{
    sga_add_patch(alpha, *g_a, ailo, aihi, ajlo, ajhi, beta, *g_b, bilo, bihi, bjlo, bjhi, *g_c, cilo, cihi, cjlo, cjhi);
}